

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

void ngram_compute_seg_score
               (ngram_search_t *ngs,bptbl_t *be,float32 lwf,int32 *out_ascr,int32 *out_lscr)

{
  dict_t *d;
  int32 iVar1;
  int iVar2;
  int32 iVar3;
  bptbl_t *pbe;
  int32 n_used;
  int32 local_34;
  
  if ((long)be->bp == -1) {
    *out_ascr = be->score;
    *out_lscr = 0;
  }
  else {
    pbe = ngs->bp_table + be->bp;
    d = (ngs->base).dict;
    iVar2 = be->wid;
    iVar1 = ngram_search_exit_score(ngs,pbe,(int)*d->word[iVar2].ciphone);
    if (iVar1 < -0x1fffffff) {
      __assert_fail("start_score BETTER_THAN WORST_SCORE",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                    ,0x2b9,
                    "void ngram_compute_seg_score(ngram_search_t *, bptbl_t *, float32, int32 *, int32 *)"
                   );
    }
    if (iVar2 == (ngs->base).silence_wid) {
      iVar2 = ngs->silpen;
    }
    else {
      iVar2 = dict_filler_word(d,iVar2);
      if (iVar2 == 0) {
        iVar3 = ngram_tg_score(ngs->lmset,be->real_wid,pbe->real_wid,pbe->prev_real_wid,&local_34);
        iVar2 = (int)((float)(iVar3 >> 10) * (float)lwf);
      }
      else {
        iVar2 = ngs->fillpen;
      }
    }
    *out_lscr = iVar2;
    *out_ascr = be->score - (iVar1 + iVar2);
  }
  return;
}

Assistant:

void
ngram_compute_seg_score(ngram_search_t *ngs, bptbl_t *be, float32 lwf,
                        int32 *out_ascr, int32 *out_lscr)
{
    bptbl_t *pbe;
    int32 start_score;

    /* Start of utterance. */
    if (be->bp == NO_BP) {
        *out_ascr = be->score;
        *out_lscr = 0;
        return;
    }

    /* Otherwise, calculate lscr and ascr. */
    pbe = ngs->bp_table + be->bp;
    start_score = ngram_search_exit_score(ngs, pbe,
                                 dict_first_phone(ps_search_dict(ngs),be->wid));
    assert(start_score BETTER_THAN WORST_SCORE);

    /* FIXME: These result in positive acoustic scores when filler
       words have non-filler pronunciations.  That whole business
       is still pretty much broken but at least it doesn't
       segfault. */
    if (be->wid == ps_search_silence_wid(ngs)) {
        *out_lscr = ngs->silpen;
    }
    else if (dict_filler_word(ps_search_dict(ngs), be->wid)) {
        *out_lscr = ngs->fillpen;
    }
    else {
        int32 n_used;
        *out_lscr = ngram_tg_score(ngs->lmset,
                                   be->real_wid,
                                   pbe->real_wid,
                                   pbe->prev_real_wid,
                                   &n_used)>>SENSCR_SHIFT;
        *out_lscr = *out_lscr * lwf;
    }
    *out_ascr = be->score - start_score - *out_lscr;
}